

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O1

void obuf_rollback_to_svp(obuf *buf,obuf_svp *svp)

{
  uint uVar1;
  int iVar2;
  size_t *psVar3;
  bool bVar4;
  
  iVar2 = buf->pos;
  if (svp->pos <= (ulong)(long)iVar2) {
    bVar4 = buf->iov[iVar2].iov_len != 0;
    uVar1 = (uint)svp->pos;
    buf->pos = uVar1;
    buf->iov[(int)uVar1].iov_len = svp->iov_len;
    buf->used = svp->used;
    if ((int)(uVar1 + 1) < (int)(iVar2 + (uint)bVar4)) {
      psVar3 = &buf->iov[(int)(uVar1 + 1)].iov_len;
      iVar2 = ~uVar1 + iVar2 + (uint)bVar4;
      do {
        *psVar3 = 0;
        psVar3 = psVar3 + 2;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    buf->reserved = false;
    return;
  }
  __assert_fail("svp->pos <= (size_t)buf->pos",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c",
                0xd5,"void obuf_rollback_to_svp(struct obuf *, struct obuf_svp *)");
}

Assistant:

void
obuf_rollback_to_svp(struct obuf *buf, struct obuf_svp *svp)
{
	assert(svp->pos <= (size_t)buf->pos);
	int iovcnt = obuf_iovcnt(buf);

	buf->pos = svp->pos;
	buf->iov[buf->pos].iov_len = svp->iov_len;
	buf->used = svp->used;
	int i;
	for (i = buf->pos + 1; i < iovcnt; i++)
		buf->iov[i].iov_len = 0;
#ifndef NDEBUG
	buf->reserved = false;
#endif
}